

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O1

float __thiscall osc::ReceivedMessageArgument::AsFloatUnchecked(ReceivedMessageArgument *this)

{
  uint uVar1;
  
  uVar1 = *(uint *)this->argumentPtr_;
  return (float)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
}

Assistant:

float ReceivedMessageArgument::AsFloatUnchecked() const
{
#ifdef OSC_HOST_LITTLE_ENDIAN
    union{
        float f;
        char c[4];
    } u;

    u.c[0] = argumentPtr_[3];
    u.c[1] = argumentPtr_[2];
    u.c[2] = argumentPtr_[1];
    u.c[3] = argumentPtr_[0];

    return u.f;
#else
	return *(float*)argument_;
#endif
}